

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void __thiscall lest::message::~message(message *this)

{
  ~message(this);
  operator_delete(this);
  return;
}

Assistant:

~message() throw() {}